

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O2

uchar FSE_decodeSymbolFast(FSE_DState_t *DStatePtr,BIT_DStream_t *bitD)

{
  byte bVar1;
  uchar uVar2;
  ushort uVar3;
  uint uVar4;
  size_t sVar5;
  void *pvVar6;
  
  sVar5 = DStatePtr->state;
  pvVar6 = DStatePtr->table;
  bVar1 = *(byte *)((long)pvVar6 + sVar5 * 4 + 3);
  if (bVar1 != 0) {
    uVar2 = *(uchar *)((long)pvVar6 + sVar5 * 4 + 2);
    uVar4 = bitD->bitsConsumed;
    uVar3 = *(ushort *)((long)pvVar6 + sVar5 * 4);
    bitD->bitsConsumed = uVar4 + bVar1;
    DStatePtr->state =
         ((bitD->bitContainer << ((byte)uVar4 & 0x3f)) >> (-bVar1 & 0x3f)) + (ulong)uVar3;
    return uVar2;
  }
  __assert_fail("nbBits >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/bitstream.h"
                ,0x15d,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
}

Assistant:

MEM_STATIC BYTE FSE_decodeSymbolFast(FSE_DState_t* DStatePtr, BIT_DStream_t* bitD)
{
    FSE_decode_t const DInfo = ((const FSE_decode_t*)(DStatePtr->table))[DStatePtr->state];
    U32 const nbBits = DInfo.nbBits;
    BYTE const symbol = DInfo.symbol;
    size_t const lowBits = BIT_readBitsFast(bitD, nbBits);

    DStatePtr->state = DInfo.newState + lowBits;
    return symbol;
}